

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# formatter.cpp
# Opt level: O0

AST * __thiscall
jsonnet::internal::SortImports::buildGroupAST
          (SortImports *this,ImportElems *imports,AST *body,Fodder *groupOpenFodder)

{
  initializer_list<jsonnet::internal::Local::Bind> __l;
  size_type sVar1;
  Bind *in_RDX;
  vector<jsonnet::internal::SortImports::ImportElem,_std::allocator<jsonnet::internal::SortImports::ImportElem>_>
  *in_RSI;
  Local *local;
  Fodder fodder;
  value_type *import;
  int i;
  Bind *in_stack_fffffffffffffe20;
  LocationRange *in_stack_fffffffffffffe30;
  allocator_type *in_stack_fffffffffffffe40;
  allocator_type *in_stack_fffffffffffffe48;
  allocator_type *in_stack_fffffffffffffe50;
  Bind *in_stack_fffffffffffffe58;
  Bind *in_stack_fffffffffffffe60;
  allocator_type *local_180;
  allocator_type local_178 [48];
  vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
  *in_stack_fffffffffffffeb8;
  vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
  *in_stack_fffffffffffffec0;
  allocator_type *local_c8;
  undefined8 local_c0;
  Bind *local_60;
  reference local_30;
  int local_24;
  Bind *local_18;
  vector<jsonnet::internal::SortImports::ImportElem,_std::allocator<jsonnet::internal::SortImports::ImportElem>_>
  *local_10;
  
  local_18 = in_RDX;
  local_10 = in_RSI;
  sVar1 = std::
          vector<jsonnet::internal::SortImports::ImportElem,_std::allocator<jsonnet::internal::SortImports::ImportElem>_>
          ::size(in_RSI);
  local_24 = (int)sVar1;
  while (local_24 = local_24 + -1, -1 < local_24) {
    local_30 = std::
               vector<jsonnet::internal::SortImports::ImportElem,_std::allocator<jsonnet::internal::SortImports::ImportElem>_>
               ::operator[](local_10,(long)local_24);
    std::vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
    ::vector((vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
              *)0x364784);
    if (local_24 == 0) {
      std::
      vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>::
      operator=(in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8);
    }
    else {
      std::
      vector<jsonnet::internal::SortImports::ImportElem,_std::allocator<jsonnet::internal::SortImports::ImportElem>_>
      ::operator[](local_10,(long)(local_24 + -1));
      std::
      vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>::
      operator=(in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8);
    }
    LocationRange::LocationRange(in_stack_fffffffffffffe30);
    local_180 = local_178;
    Local::Bind::Bind(in_stack_fffffffffffffe60,in_stack_fffffffffffffe58);
    local_c8 = local_178;
    local_c0 = 1;
    in_stack_fffffffffffffe60 = (Bind *)&stack0xfffffffffffffe7f;
    std::allocator<jsonnet::internal::Local::Bind>::allocator
              ((allocator<jsonnet::internal::Local::Bind> *)0x364852);
    __l._M_len = (size_type)in_stack_fffffffffffffe60;
    __l._M_array = in_stack_fffffffffffffe58;
    std::vector<jsonnet::internal::Local::Bind,_std::allocator<jsonnet::internal::Local::Bind>_>::
    vector((vector<jsonnet::internal::Local::Bind,_std::allocator<jsonnet::internal::Local::Bind>_>
            *)in_stack_fffffffffffffe50,__l,in_stack_fffffffffffffe48);
    in_stack_fffffffffffffe58 =
         (Bind *)Allocator::
                 make<jsonnet::internal::Local,jsonnet::internal::LocationRange,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>&,std::vector<jsonnet::internal::Local::Bind,std::allocator<jsonnet::internal::Local::Bind>>,jsonnet::internal::AST*&>
                           ((Allocator *)in_stack_fffffffffffffe60,
                            (LocationRange *)in_stack_fffffffffffffe58,
                            (vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                             *)in_stack_fffffffffffffe50,
                            (vector<jsonnet::internal::Local::Bind,_std::allocator<jsonnet::internal::Local::Bind>_>
                             *)in_stack_fffffffffffffe48,(AST **)in_stack_fffffffffffffe40);
    std::vector<jsonnet::internal::Local::Bind,_std::allocator<jsonnet::internal::Local::Bind>_>::
    ~vector((vector<jsonnet::internal::Local::Bind,_std::allocator<jsonnet::internal::Local::Bind>_>
             *)in_stack_fffffffffffffe30);
    std::allocator<jsonnet::internal::Local::Bind>::~allocator
              ((allocator<jsonnet::internal::Local::Bind> *)0x3648be);
    in_stack_fffffffffffffe48 = local_178;
    in_stack_fffffffffffffe40 = (allocator_type *)&local_c8;
    do {
      in_stack_fffffffffffffe40 = in_stack_fffffffffffffe40 + -0xb0;
      Local::Bind::~Bind(in_stack_fffffffffffffe20);
    } while (in_stack_fffffffffffffe40 != in_stack_fffffffffffffe48);
    in_stack_fffffffffffffe50 = in_stack_fffffffffffffe40;
    LocationRange::~LocationRange((LocationRange *)0x36490a);
    local_60 = in_stack_fffffffffffffe58;
    local_18 = in_stack_fffffffffffffe58;
    std::vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
    ::~vector((vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
               *)in_stack_fffffffffffffe30);
  }
  return (AST *)local_18;
}

Assistant:

AST *buildGroupAST(ImportElems &imports, AST *body, const Fodder &groupOpenFodder)
    {
        for (int i = imports.size() - 1; i >= 0; --i) {
            auto &import = imports[i];
            Fodder fodder;
            if (i == 0) {
                fodder = groupOpenFodder;
            } else {
                fodder = imports[i - 1].adjacentFodder;
            }
            auto *local =
                alloc.make<Local>(LocationRange(), fodder, Local::Binds({import.bind}), body);
            body = local;
        }

        return body;
    }